

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratbuilder.cpp
# Opt level: O0

void __thiscall CaDiCaL::LratBuilder::collect_garbage_clauses(LratBuilder *this)

{
  uint uVar1;
  bool bVar2;
  reference pLVar3;
  reference pLVar4;
  reference ppLVar5;
  vector<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_> *in_RDI;
  LratBuilderClause *next;
  LratBuilderClause *c_1;
  LratBuilderClause *c;
  iterator i_1;
  iterator j;
  iterator end;
  LratBuilderWatch *w;
  iterator i;
  iterator j_1;
  iterator end_1;
  LratBuilderWatcher *ws;
  int lit;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  LratBuilder *in_stack_ffffffffffffff30;
  pointer *__lhs;
  LratBuilderClause *in_stack_ffffffffffffff38;
  LratBuilderClause *this_00;
  LratBuilder *in_stack_ffffffffffffff40;
  reference in_stack_ffffffffffffff48;
  LratBuilderClause *local_a0;
  __normal_iterator<CaDiCaL::LratBuilderClause_**,_std::vector<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>_>
  local_88;
  LratBuilderClause *local_80;
  __normal_iterator<CaDiCaL::LratBuilderClause_**,_std::vector<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>_>
  local_78;
  LratBuilderClause **local_70;
  LratBuilderClause **local_68;
  LratBuilderWatch *local_60;
  LratBuilderWatch *local_58;
  LratBuilderWatch *local_50;
  LratBuilderWatch *local_48;
  __normal_iterator<CaDiCaL::LratBuilderWatch_*,_std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>_>
  local_40;
  reference local_38;
  __normal_iterator<CaDiCaL::LratBuilderWatch_*,_std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>_>
  local_30;
  LratBuilderWatch *local_28;
  LratBuilderWatch *local_20;
  LratBuilder *local_18;
  int local_c;
  
  (((_Vector_base<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_> *)
   &in_RDI[0x19].
    super__Vector_base<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>)
  ->_M_impl).super__Vector_impl_data._M_start =
       (pointer)((long)&((((_Vector_base<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
                            *)&in_RDI[0x19].
                               super__Vector_base<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>
                          )->_M_impl).super__Vector_impl_data._M_start)->blit + 1);
  local_c = -(int)(((_Vector_base<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
                     *)&in_RDI->
                        super__Vector_base<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>
                   )->_M_impl).super__Vector_impl_data._M_finish;
  while (local_c = local_c + 1,
        (long)local_c <
        (long)(((_Vector_base<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
                 *)&in_RDI->
                    super__Vector_base<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>
               )->_M_impl).super__Vector_impl_data._M_finish) {
    if (local_c != 0) {
      local_18 = (LratBuilder *)watcher(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
      local_20 = (LratBuilderWatch *)
                 std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
                 ::end((vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
                        *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      local_30._M_current =
           (LratBuilderWatch *)
           std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>::begin
                     ((vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
                       *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      local_28 = local_30._M_current;
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<CaDiCaL::LratBuilderWatch_*,_std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>_>
                                 *)in_stack_ffffffffffffff30,
                                (__normal_iterator<CaDiCaL::LratBuilderWatch_*,_std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)),
            bVar2) {
        pLVar3 = __gnu_cxx::
                 __normal_iterator<CaDiCaL::LratBuilderWatch_*,_std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>_>
                 ::operator*(&local_30);
        local_38 = pLVar3;
        if ((pLVar3->clause->garbage & 1U) == 0) {
          local_40 = __gnu_cxx::
                     __normal_iterator<CaDiCaL::LratBuilderWatch_*,_std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>_>
                     ::operator++((__normal_iterator<CaDiCaL::LratBuilderWatch_*,_std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>_>
                                   *)in_stack_ffffffffffffff38,
                                  (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
          pLVar4 = __gnu_cxx::
                   __normal_iterator<CaDiCaL::LratBuilderWatch_*,_std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>_>
                   ::operator*(&local_40);
          uVar1 = pLVar3->size;
          pLVar4->blit = pLVar3->blit;
          pLVar4->size = uVar1;
          pLVar4->clause = pLVar3->clause;
          in_stack_ffffffffffffff48 = pLVar3;
        }
        local_48 = (LratBuilderWatch *)
                   __gnu_cxx::
                   __normal_iterator<CaDiCaL::LratBuilderWatch_*,_std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>_>
                   ::operator++((__normal_iterator<CaDiCaL::LratBuilderWatch_*,_std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>_>
                                 *)in_stack_ffffffffffffff38,
                                (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
      }
      local_50 = (LratBuilderWatch *)
                 std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
                 ::end((vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
                        *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      bVar2 = __gnu_cxx::operator==
                        ((__normal_iterator<CaDiCaL::LratBuilderWatch_*,_std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>_>
                          *)in_stack_ffffffffffffff30,
                         (__normal_iterator<CaDiCaL::LratBuilderWatch_*,_std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      if (!bVar2) {
        local_58 = (LratBuilderWatch *)
                   std::
                   vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>::
                   begin((vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
                          *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        bVar2 = __gnu_cxx::operator==
                          ((__normal_iterator<CaDiCaL::LratBuilderWatch_*,_std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>_>
                            *)in_stack_ffffffffffffff30,
                           (__normal_iterator<CaDiCaL::LratBuilderWatch_*,_std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        if (bVar2) {
          erase_vector<CaDiCaL::LratBuilderWatch>
                    ((vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
                      *)in_stack_ffffffffffffff40);
        }
        else {
          in_stack_ffffffffffffff40 = local_18;
          local_60 = (LratBuilderWatch *)
                     std::
                     vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>::
                     begin((vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
                            *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          __gnu_cxx::operator-
                    ((__normal_iterator<CaDiCaL::LratBuilderWatch_*,_std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>_>
                      *)in_stack_ffffffffffffff30,
                     (__normal_iterator<CaDiCaL::LratBuilderWatch_*,_std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>::resize
                    ((vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
                      *)in_RDI,(size_type)in_stack_ffffffffffffff48);
        }
      }
    }
  }
  local_68 = (LratBuilderClause **)
             std::
             vector<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>::
             end((vector<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>
                  *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_78._M_current =
       (LratBuilderClause **)
       std::vector<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>::
       begin((vector<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_70 = local_78._M_current;
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<CaDiCaL::LratBuilderClause_**,_std::vector<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>_>
                             *)in_stack_ffffffffffffff30,
                            (__normal_iterator<CaDiCaL::LratBuilderClause_**,_std::vector<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)), bVar2
        ) {
    ppLVar5 = __gnu_cxx::
              __normal_iterator<CaDiCaL::LratBuilderClause_**,_std::vector<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>_>
              ::operator*(&local_78);
    this_00 = *ppLVar5;
    local_80 = this_00;
    if ((this_00->garbage & 1U) == 0) {
      local_88 = __gnu_cxx::
                 __normal_iterator<CaDiCaL::LratBuilderClause_**,_std::vector<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>_>
                 ::operator++((__normal_iterator<CaDiCaL::LratBuilderClause_**,_std::vector<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>_>
                               *)this_00,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
      ppLVar5 = __gnu_cxx::
                __normal_iterator<CaDiCaL::LratBuilderClause_**,_std::vector<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>_>
                ::operator*(&local_88);
      *ppLVar5 = this_00;
      in_stack_ffffffffffffff38 = this_00;
    }
    __gnu_cxx::
    __normal_iterator<CaDiCaL::LratBuilderClause_**,_std::vector<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>_>
    ::operator++((__normal_iterator<CaDiCaL::LratBuilderClause_**,_std::vector<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>_>
                  *)in_stack_ffffffffffffff38,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
  }
  __lhs = &(((_Vector_base<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_> *)
            &in_RDI[0x12].
             super__Vector_base<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>
            )->_M_impl).super__Vector_impl_data._M_end_of_storage;
  std::vector<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>::begin
            ((vector<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  __gnu_cxx::operator-
            ((__normal_iterator<CaDiCaL::LratBuilderClause_**,_std::vector<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>_>
              *)__lhs,(__normal_iterator<CaDiCaL::LratBuilderClause_**,_std::vector<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>_>
                       *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::vector<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>::resize
            (in_RDI,(size_type)in_stack_ffffffffffffff48);
  local_a0 = (LratBuilderClause *)
             in_RDI[0xe].
             super__Vector_base<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  while (local_a0 != (LratBuilderClause *)0x0) {
    local_a0 = local_a0->next;
    delete_clause(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  in_RDI[0xe].
  super__Vector_base<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

void LratBuilder::collect_garbage_clauses () {

  stats.collections++;

  LOG ("LRAT BUILDER collecting %" PRIu64 " garbage clauses %.0f%%",
       num_garbage, percent (num_garbage, num_clauses));

  for (int lit = -size_vars + 1; lit < size_vars; lit++) {
    if (!lit)
      continue;
    LratBuilderWatcher &ws = watcher (lit);
    const auto end = ws.end ();
    auto j = ws.begin (), i = j;
    for (; i != end; i++) {
      LratBuilderWatch &w = *i;
      if (!w.clause->garbage)
        *j++ = w;
    }
    if (j == ws.end ())
      continue;
    if (j == ws.begin ())
      erase_vector (ws);
    else
      ws.resize (j - ws.begin ());
  }

  const auto end = unit_clauses.end ();
  auto j = unit_clauses.begin ();
  for (auto i = j; i != end; i++) {
    LratBuilderClause *c = *i;
    if (c->garbage)
      continue; // garbage clause
    *j++ = c;
  }
  unit_clauses.resize (j - unit_clauses.begin ());

  for (LratBuilderClause *c = garbage, *next; c; c = next)
    next = c->next, delete_clause (c);

  assert (!num_garbage);
  garbage = 0;
}